

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

bool __thiscall
slang::analysis::AnalysisScopeVisitor::shouldWarn(AnalysisScopeVisitor *this,Symbol *symbol)

{
  Scope *this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  this_00 = symbol->parentScope;
  bVar1 = ast::Scope::isUninstantiated(this_00);
  if (((!bVar1) && (this_00->thisSym->kind != Package)) &&
     (__x._M_len = (symbol->name)._M_len, __x._M_str = (symbol->name)._M_str, __y._M_str = "_",
     __y._M_len = 1, bVar1 = std::operator==(__x,__y), !bVar1)) {
    bVar1 = hasUnusedAttrib(this_00->compilation,symbol);
    return !bVar1;
  }
  return false;
}

Assistant:

bool shouldWarn(const Symbol& symbol) {
        auto scope = symbol.getParentScope();
        return !scope->isUninstantiated() && scope->asSymbol().kind != SymbolKind::Package &&
               symbol.name != "_"sv && !hasUnusedAttrib(scope->getCompilation(), symbol);
    }